

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

void lodepng::convertToXYZ_gamma_table
               (float *out,size_t n,size_t c,LodePNGInfo *info,uint use_icc,LodePNGICC *icc)

{
  uint uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  size_t sVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  float fVar10;
  long lVar8;
  
  auVar2 = _DAT_0012a3b0;
  lVar8 = n - 1;
  fVar10 = 1.0 / (float)lVar8;
  if (use_icc == 0) {
    if ((info->gama_defined == 0) || (info->srgb_defined != 0)) {
      if (n != 0) {
        sVar4 = 0;
        do {
          fVar5 = (float)(long)sVar4 * fVar10;
          if (0.04045 <= fVar5) {
            fVar5 = lodepng_powf((fVar5 + 0.055) / 1.055,2.4);
          }
          else {
            fVar5 = fVar5 / 12.92;
          }
          out[sVar4] = fVar5;
          sVar4 = sVar4 + 1;
        } while (n != sVar4);
      }
    }
    else {
      uVar1 = info->gama_gamma;
      if (uVar1 == 100000) {
        if (n != 0) {
          auVar6._8_4_ = (int)lVar8;
          auVar6._0_8_ = lVar8;
          auVar6._12_4_ = (int)((ulong)lVar8 >> 0x20);
          uVar3 = 0;
          auVar6 = auVar6 ^ _DAT_0012a3b0;
          auVar7 = _DAT_0012a3a0;
          do {
            auVar9 = auVar7 ^ auVar2;
            if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                        auVar6._4_4_ < auVar9._4_4_) & 1)) {
              out[uVar3] = (float)(long)uVar3 * fVar10;
            }
            if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
                auVar9._12_4_ <= auVar6._12_4_) {
              out[uVar3 + 1] = (float)(long)(uVar3 + 1) * fVar10;
            }
            uVar3 = uVar3 + 2;
            lVar8 = auVar7._8_8_;
            auVar7._0_8_ = auVar7._0_8_ + 2;
            auVar7._8_8_ = lVar8 + 2;
          } while ((n + 1 & 0xfffffffffffffffe) != uVar3);
        }
      }
      else if (n != 0) {
        sVar4 = 0;
        do {
          fVar5 = lodepng_powf((float)(long)sVar4 * fVar10,100000.0 / (float)uVar1);
          out[sVar4] = fVar5;
          sVar4 = sVar4 + 1;
        } while (n != sVar4);
      }
    }
  }
  else if (n != 0) {
    sVar4 = 0;
    do {
      fVar5 = iccForwardTRC(icc->trc + c,(float)(long)sVar4 * fVar10);
      out[sVar4] = fVar5;
      sVar4 = sVar4 + 1;
    } while (n != sVar4);
  }
  return;
}

Assistant:

static void convertToXYZ_gamma_table(float* out, size_t n, size_t c,
                                     const LodePNGInfo* info, unsigned use_icc, const LodePNGICC* icc) {
  size_t i;
  float mul = 1.0f / (n - 1);
  if(use_icc) {
    for(i = 0; i < n; i++) {
      float v = i * mul;
      out[i] = iccForwardTRC(&icc->trc[c], v);
    }
  } else if(info->gama_defined && !info->srgb_defined) {
    /* no power needed if gamma is 1 */
    if(info->gama_gamma == 100000) {
      for(i = 0; i < n; i++) {
        out[i] = i * mul;
      }
    } else {
      float gamma = 100000.0f / info->gama_gamma;
      for(i = 0; i < n; i++) {
        float v = i * mul;
        out[i] = lodepng_powf(v, gamma);
      }
    }
  } else {
    for(i = 0; i < n; i++) {
      /* sRGB gamma expand */
      float v = i * mul;
      out[i] = (v < 0.04045f) ? (v / 12.92f) : lodepng_powf((v + 0.055f) / 1.055f, 2.4f);
    }
  }
}